

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

void __thiscall QHostAddress::setAddress(QHostAddress *this,Q_IPV6ADDR *ip6Addr)

{
  QHostAddressPrivate *pQVar1;
  quint64 qVar2;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHostAddressPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
  }
  pQVar1 = (this->d).d.ptr;
  pQVar1->protocol = '\x01';
  qVar2 = *(quint64 *)(ip6Addr->c + 8);
  (pQVar1->field_1).a6_64.c[0] = *(quint64 *)ip6Addr->c;
  (pQVar1->field_1).a6_64.c[1] = qVar2;
  pQVar1->a = 0;
  convertToIpv4(&pQVar1->a,&(pQVar1->field_1).a6,(ConversionMode)0x5);
  return;
}

Assistant:

void QHostAddress::setAddress(const Q_IPV6ADDR &ip6Addr)
{
    d.detach();
    d->setAddress(ip6Addr);
}